

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  byte *pbVar1;
  byte bVar2;
  align_t align;
  byte *pbVar3;
  bool bVar4;
  basic_string_view<char> s;
  error_handler local_19;
  
  pbVar1 = (byte *)(begin + 1);
  pbVar3 = pbVar1;
  if ((*begin < '\0') && (pbVar3 = (byte *)end, pbVar1 != (byte *)end)) {
    pbVar3 = pbVar1;
  }
  if (pbVar3 == (byte *)end) {
    pbVar3 = (byte *)begin;
  }
  do {
    bVar2 = *pbVar3;
    if (bVar2 < 0x3e) {
      if (bVar2 == 0x3c) {
        align = left;
LAB_00134a94:
        s.size_ = (long)pbVar3 - (long)begin;
        if (s.size_ != 0) {
          if (*begin == '{') {
            error_handler::on_error(&local_19,"invalid fill character \'{\'");
          }
          s.data_ = begin;
          fill_t<char>::operator=
                    (&((handler->
                       super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                       ).super_specs_setter<char>.specs_)->fill,s);
          begin = (char *)pbVar3;
        }
        specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
        ::on_align(handler,align);
        return (char *)((byte *)begin + 1);
      }
      if (bVar2 == 0x3d) {
        align = numeric;
        goto LAB_00134a94;
      }
    }
    else {
      if (bVar2 == 0x3e) {
        align = right;
        goto LAB_00134a94;
      }
      if (bVar2 == 0x5e) {
        align = center;
        goto LAB_00134a94;
      }
    }
    bVar4 = pbVar3 == (byte *)begin;
    pbVar3 = (byte *)begin;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}